

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

QSize __thiscall QToolBarAreaLayout::sizeHint(QToolBarAreaLayout *this,QSize *centerHint)

{
  QSize QVar1;
  QSize QVar2;
  QSize QVar3;
  QSize QVar4;
  Representation RVar5;
  ulong uVar6;
  Representation RVar7;
  QSize QVar8;
  Representation local_48;
  
  QVar8 = *centerHint;
  uVar6 = (ulong)QVar8 >> 0x20;
  if (this->visible == true) {
    QVar1 = QToolBarAreaLayoutInfo::sizeHint(this->docks);
    QVar2 = QToolBarAreaLayoutInfo::sizeHint(this->docks + 1);
    QVar3 = QToolBarAreaLayoutInfo::sizeHint(this->docks + 2);
    QVar4 = QToolBarAreaLayoutInfo::sizeHint(this->docks + 3);
    RVar7.m_i = QVar8.wd.m_i.m_i;
    if (QVar8.wd.m_i.m_i < QVar3.wd.m_i.m_i) {
      RVar7.m_i = QVar3.wd.m_i.m_i;
    }
    if (RVar7.m_i <= QVar4.wd.m_i.m_i) {
      RVar7.m_i = QVar4.wd.m_i.m_i;
    }
    RVar5.m_i = QVar8.ht.m_i.m_i;
    if (QVar8.ht.m_i.m_i < QVar1.ht.m_i.m_i) {
      RVar5.m_i = QVar1.ht.m_i.m_i;
    }
    if (RVar5.m_i <= QVar2.ht.m_i.m_i) {
      RVar5.m_i = QVar2.ht.m_i.m_i;
    }
    QVar8.wd.m_i = RVar7.m_i + QVar1.wd.m_i.m_i + QVar2.wd.m_i.m_i;
    QVar8.ht.m_i = 0;
    local_48 = QVar3.ht.m_i;
    uVar6 = (ulong)(uint)(QVar4.ht.m_i.m_i + local_48.m_i + RVar5.m_i);
  }
  return (QSize)((ulong)QVar8 & 0xffffffff | uVar6 << 0x20);
}

Assistant:

QSize QToolBarAreaLayout::sizeHint(const QSize &centerHint) const
{
    if (!visible)
        return centerHint;

    QSize result = centerHint;

    QSize left_hint = docks[QInternal::LeftDock].sizeHint();
    QSize right_hint = docks[QInternal::RightDock].sizeHint();
    QSize top_hint = docks[QInternal::TopDock].sizeHint();
    QSize bottom_hint = docks[QInternal::BottomDock].sizeHint();

    result.setWidth(qMax(top_hint.width(), result.width()));
    result.setWidth(qMax(bottom_hint.width(), result.width()));
    result.setHeight(qMax(left_hint.height(), result.height()));
    result.setHeight(qMax(right_hint.height(), result.height()));

    result.rwidth() += left_hint.width() + right_hint.width();
    result.rheight() += top_hint.height() + bottom_hint.height();

    return result;
}